

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  int a;
  int b;
  undefined8 *puVar1;
  stbi__uint32 b_00;
  stbi__context *s;
  byte bVar2;
  uint uVar3;
  stbi__uint32 sVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  stbi_uc *psVar8;
  byte *pbVar9;
  void *pvVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  
  s = z->s;
  uVar3 = stbi__get16be(s);
  if (uVar3 < 0xb) goto LAB_00142a6b;
  psVar8 = s->img_buffer;
  if (s->img_buffer_end <= psVar8) {
    if (s->read_from_callbacks == 0) goto LAB_00142ae2;
    stbi__refill_buffer(s);
    psVar8 = s->img_buffer;
  }
  s->img_buffer = psVar8 + 1;
  if (*psVar8 != '\b') {
LAB_00142ae2:
    stbi__g_failure_reason = "only 8-bit";
    return 0;
  }
  sVar4 = stbi__get16be(s);
  s->img_y = sVar4;
  if (sVar4 == 0) {
    stbi__g_failure_reason = "no header height";
    return 0;
  }
  sVar4 = stbi__get16be(s);
  s->img_x = sVar4;
  if (sVar4 == 0) {
    stbi__g_failure_reason = "0 width";
    return 0;
  }
  if (0x1000000 < s->img_y) {
    stbi__g_failure_reason = "too large";
    return 0;
  }
  pbVar9 = s->img_buffer;
  if (pbVar9 < s->img_buffer_end) {
LAB_00142b41:
    s->img_buffer = pbVar9 + 1;
    bVar2 = *pbVar9;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar9 = s->img_buffer;
      goto LAB_00142b41;
    }
    bVar2 = 0;
  }
  if ((4 < bVar2) || ((0x1aU >> (bVar2 & 0x1f) & 1) == 0)) {
    stbi__g_failure_reason = "bad component count";
    return 0;
  }
  s->img_n = (uint)bVar2;
  if (bVar2 != 0) {
    lVar12 = 0;
    do {
      *(undefined8 *)((long)&z->img_comp[0].data + lVar12) = 0;
      *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar12) = 0;
      lVar12 = lVar12 + 0x60;
    } while ((ulong)bVar2 * 0x60 != lVar12);
  }
  if (uVar3 == (uint)bVar2 + (uint)bVar2 * 2 + 8) {
    z->rgb = 0;
    uVar18 = (ulong)(uint)s->img_n;
    if (0 < s->img_n) {
      piVar14 = &z->img_comp[0].tq;
      lVar12 = 0;
      do {
        pbVar9 = s->img_buffer;
        if (pbVar9 < s->img_buffer_end) {
LAB_00142bef:
          s->img_buffer = pbVar9 + 1;
          bVar2 = *pbVar9;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar9 = s->img_buffer;
            goto LAB_00142bef;
          }
          bVar2 = 0;
        }
        ((anon_struct_96_18_0d0905d3 *)(piVar14 + -3))->id = (uint)bVar2;
        if ((s->img_n == 3) && (bVar2 == "RGB"[lVar12])) {
          z->rgb = z->rgb + 1;
        }
        pbVar9 = s->img_buffer;
        if (pbVar9 < s->img_buffer_end) {
LAB_00142c49:
          s->img_buffer = pbVar9 + 1;
          bVar2 = *pbVar9;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar9 = s->img_buffer;
            goto LAB_00142c49;
          }
          bVar2 = 0;
        }
        piVar14[-2] = (uint)(bVar2 >> 4);
        if ((byte)(bVar2 + 0xb0) < 0xc0) goto LAB_00142f8e;
        piVar14[-1] = bVar2 & 0xf;
        if ((bVar2 & 0xf) - 5 < 0xfffffffc) goto LAB_00142f9a;
        pbVar9 = s->img_buffer;
        if (pbVar9 < s->img_buffer_end) {
LAB_00142ca9:
          s->img_buffer = pbVar9 + 1;
          bVar2 = *pbVar9;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar9 = s->img_buffer;
            goto LAB_00142ca9;
          }
          bVar2 = 0;
        }
        *piVar14 = (uint)bVar2;
        if (3 < bVar2) {
          stbi__g_failure_reason = "bad TQ";
          return 0;
        }
        lVar12 = lVar12 + 1;
        uVar18 = (ulong)s->img_n;
        piVar14 = piVar14 + 0x18;
      } while (lVar12 < (long)uVar18);
    }
    if (scan != 0) {
      return 1;
    }
    sVar4 = s->img_x;
    b_00 = s->img_y;
    iVar7 = (int)uVar18;
    iVar5 = stbi__mad3sizes_valid(sVar4,b_00,iVar7,0);
    if (iVar5 == 0) {
      stbi__g_failure_reason = "too large";
      return 0;
    }
    if (iVar7 < 1) {
      uVar16 = 1;
      uVar11 = 1;
    }
    else {
      uVar11 = 1;
      lVar12 = 0;
      uVar16 = 1;
      do {
        uVar3 = *(uint *)((long)&z->img_comp[0].h + lVar12);
        uVar6 = *(uint *)((long)&z->img_comp[0].v + lVar12);
        if ((int)uVar16 < (int)uVar3) {
          uVar16 = (ulong)uVar3;
        }
        if ((int)uVar11 < (int)uVar6) {
          uVar11 = (ulong)uVar6;
        }
        lVar12 = lVar12 + 0x60;
      } while ((uVar18 & 0xffffffff) * 0x60 != lVar12);
    }
    iVar15 = (int)uVar16;
    iVar5 = (int)uVar11;
    if (0 < iVar7) {
      lVar12 = 0;
      do {
        if (iVar15 % *(int *)((long)&z->img_comp[0].h + lVar12) != 0) {
LAB_00142f8e:
          stbi__g_failure_reason = "bad H";
          return 0;
        }
        if (iVar5 % *(int *)((long)&z->img_comp[0].v + lVar12) != 0) {
LAB_00142f9a:
          stbi__g_failure_reason = "bad V";
          return 0;
        }
        lVar12 = lVar12 + 0x60;
      } while ((uVar18 & 0xffffffff) * 0x60 != lVar12);
    }
    z->img_h_max = iVar15;
    z->img_v_max = iVar5;
    z->img_mcu_w = iVar15 * 8;
    z->img_mcu_h = iVar5 * 8;
    uVar3 = ((sVar4 + iVar15 * 8) - 1) / (uint)(iVar15 * 8);
    z->img_mcu_x = uVar3;
    uVar6 = ((b_00 + iVar5 * 8) - 1) / (uint)(iVar5 * 8);
    z->img_mcu_y = uVar6;
    if (iVar7 < 1) {
      return 1;
    }
    iVar7 = 1;
    lVar12 = 0;
    while( true ) {
      iVar13 = *(int *)((long)&z->img_comp[0].h + lVar12);
      iVar17 = *(int *)((long)&z->img_comp[0].v + lVar12);
      *(int *)((long)&z->img_comp[0].x + lVar12) = (int)((iVar13 * sVar4 + iVar15 + -1) / uVar16);
      *(int *)((long)&z->img_comp[0].y + lVar12) = (int)((iVar17 * b_00 + iVar5 + -1) / uVar11);
      iVar13 = iVar13 * uVar3;
      a = iVar13 * 8;
      *(int *)((long)&z->img_comp[0].w2 + lVar12) = a;
      iVar17 = iVar17 * uVar6;
      b = iVar17 * 8;
      *(int *)((long)&z->img_comp[0].h2 + lVar12) = b;
      pvVar10 = stbi__malloc_mad2(a,b,0xf);
      puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar12);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&z->img_comp[0].coeff + lVar12) = 0;
      *(void **)((long)&z->img_comp[0].raw_data + lVar12) = pvVar10;
      why = extraout_EDX;
      if (pvVar10 == (void *)0x0) break;
      *(ulong *)((long)&z->img_comp[0].data + lVar12) = (long)pvVar10 + 0xfU & 0xfffffffffffffff0;
      if (z->progressive != 0) {
        *(int *)((long)&z->img_comp[0].coeff_w + lVar12) = iVar13;
        *(int *)((long)&z->img_comp[0].coeff_h + lVar12) = iVar17;
        pvVar10 = stbi__malloc_mad3(a,b,2,0xf);
        *(void **)((long)&z->img_comp[0].raw_coeff + lVar12) = pvVar10;
        why = extraout_EDX_00;
        if (pvVar10 == (void *)0x0) break;
        *(ulong *)((long)&z->img_comp[0].coeff + lVar12) = (long)pvVar10 + 0xfU & 0xfffffffffffffff0
        ;
      }
      iVar7 = iVar7 + 1;
      lVar12 = lVar12 + 0x60;
      if ((uVar18 & 0xffffffff) * 0x60 == lVar12) {
        return 1;
      }
    }
    stbi__g_failure_reason = "outofmem";
    stbi__free_jpeg_components(z,iVar7,why);
    return 0;
  }
LAB_00142a6b:
  stbi__g_failure_reason = "bad SOF len";
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // check that plane subsampling factors are integer ratios; our resamplers can't deal with fractional ratios
   // and I've never seen a non-corrupted JPEG file actually use them
   for (i=0; i < s->img_n; ++i) {
      if (h_max % z->img_comp[i].h != 0) return stbi__err("bad H","Corrupt JPEG");
      if (v_max % z->img_comp[i].v != 0) return stbi__err("bad V","Corrupt JPEG");
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}